

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

bool __thiscall LowererMD::Simd128TryLowerMappedInstruction(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  intptr_t pMemLoc;
  Opnd *pOVar6;
  MemRefOpnd *newSrc;
  
  OVar1 = this->m_simd128OpCodesMap[*(int *)&instr->m_opcode - 0x299U & 0xffff];
  if (OVar1 == EndOfBlock) goto LAB_005e8f2e;
  bVar4 = IR::Opnd::IsRegOpnd(instr->m_dst);
  pOVar6 = instr->m_dst;
  if (bVar4) {
    bVar4 = IR::Opnd::IsSimd128(pOVar6);
    if (!bVar4) {
      pOVar6 = instr->m_dst;
      goto LAB_005e8b7f;
    }
  }
  else {
LAB_005e8b7f:
    if (pOVar6->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x38,
                         "(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32)"
                         ,
                         "instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32"
                        );
      if (!bVar4) goto LAB_005e9074;
      *puVar5 = 0;
    }
  }
  if (instr->m_src1 == (Opnd *)0x0) {
LAB_005e8bf4:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x39,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128())"
                       ,
                       "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128()"
                      );
    if (!bVar4) goto LAB_005e9074;
    *puVar5 = 0;
  }
  else {
    bVar4 = IR::Opnd::IsRegOpnd(instr->m_src1);
    if (!bVar4) goto LAB_005e8bf4;
    bVar4 = IR::Opnd::IsSimd128(instr->m_src1);
    if (!bVar4) goto LAB_005e8bf4;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    bVar4 = IR::Opnd::IsRegOpnd(instr->m_src2);
    if (bVar4) {
      bVar4 = IR::Opnd::IsSimd128(instr->m_src2);
      if (bVar4) goto LAB_005e8cca;
    }
    bVar4 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
    if ((!bVar4) || (instr->m_src2->m_type != TyInt8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x3a,
                         "(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))))"
                         ,
                         "!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8)))"
                        );
      if (!bVar4) goto LAB_005e9074;
      *puVar5 = 0;
    }
  }
LAB_005e8cca:
  OVar2 = instr->m_opcode;
  if ((OVar2 - 0x3a0 < 0x2b) && ((0x40100000001U >> ((ulong)(OVar2 - 0x3a0) & 0x3f) & 1) != 0)) {
LAB_005e8e95:
    if (OVar1 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x57,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar4) {
LAB_005e9074:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pMemLoc = ThreadContextInfo::GetX86AllNegOnesAddr(this->m_func->m_threadContextInfo);
    goto LAB_005e8efa;
  }
  if ((OVar2 - 0x2c7 < 2) || ((OVar2 - 0x2de < 2 || (OVar2 == Simd128_Lt_I4)))) goto LAB_005e8df4;
  if ((OVar2 == Simd128_Not_I4) || (OVar2 == Simd128_Not_U8)) goto LAB_005e8e95;
  if (OVar2 == Simd128_Neg_F4) {
    if (OVar1 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x47,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar4) goto LAB_005e9074;
      *puVar5 = 0;
    }
    pMemLoc = ThreadContextInfo::GetX86NegMaskF4Addr(this->m_func->m_threadContextInfo);
LAB_005e8efa:
    newSrc = IR::MemRefOpnd::New(pMemLoc,instr->m_src1->m_type,this->m_func,AddrOpndKindDynamicMisc)
    ;
LAB_005e8f14:
    IR::Instr::SetSrc2(instr,&newSrc->super_Opnd);
  }
  else {
    if (OVar2 == Simd128_Neg_D2) {
      if (OVar1 != XORPS) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x4b,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
        if (!bVar4) goto LAB_005e9074;
        *puVar5 = 0;
      }
      pMemLoc = ThreadContextInfo::GetX86NegMaskD2Addr(this->m_func->m_threadContextInfo);
      goto LAB_005e8efa;
    }
    if (OVar2 == Simd128_Abs_D2) {
      if (OVar1 != ANDPD) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x43,"(opcode == Js::OpCode::ANDPD)","opcode == Js::OpCode::ANDPD");
        if (!bVar4) goto LAB_005e9074;
        *puVar5 = 0;
      }
      pMemLoc = ThreadContextInfo::GetX86AbsMaskD2Addr(this->m_func->m_threadContextInfo);
      goto LAB_005e8efa;
    }
    if (OVar2 == Simd128_Lt_I16) {
LAB_005e8df4:
      if ((3 < OVar1 - 0x3f9) && (2 < OVar1 - 0x461)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,100,
                           "(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW)"
                           ,
                           "opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW"
                          );
        if (!bVar4) goto LAB_005e9074;
        *puVar5 = 0;
      }
      newSrc = (MemRefOpnd *)IR::Instr::UnlinkSrc1(instr);
      pOVar6 = IR::Instr::UnlinkSrc2(instr);
      IR::Instr::SetSrc1(instr,pOVar6);
      goto LAB_005e8f14;
    }
    if (((OVar2 == Simd128_Not_I16) || (OVar2 == Simd128_Not_B16)) || (OVar2 == Simd128_Not_I8))
    goto LAB_005e8e95;
    if (OVar2 == Simd128_Lt_I8) goto LAB_005e8df4;
    if (OVar2 == Simd128_Not_U4) goto LAB_005e8e95;
    if (OVar2 == Simd128_Abs_F4) {
      if (OVar1 != ANDPS) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x3f,"(opcode == Js::OpCode::ANDPS)","opcode == Js::OpCode::ANDPS");
        if (!bVar4) goto LAB_005e9074;
        *puVar5 = 0;
      }
      pMemLoc = ThreadContextInfo::GetX86AbsMaskF4Addr(this->m_func->m_threadContextInfo);
      goto LAB_005e8efa;
    }
  }
  instr->m_opcode = OVar1;
  Legalize<false>(instr,false);
LAB_005e8f2e:
  return OVar1 != EndOfBlock;
}

Assistant:

bool LowererMD::Simd128TryLowerMappedInstruction(IR::Instr *instr)
{
    bool legalize = true;
    Js::OpCode opcode = GET_SIMDOPCODE(instr->m_opcode);

    if ((uint32)opcode == 0)
        return false;

    Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32);
    Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128());
    Assert(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))));

    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_Abs_F4:
        Assert(opcode == Js::OpCode::ANDPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Abs_D2:
        Assert(opcode == Js::OpCode::ANDPD);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_F4:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_D2:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Not_I4:
    case Js::OpCode::Simd128_Not_I16:
    case Js::OpCode::Simd128_Not_I8:
    case Js::OpCode::Simd128_Not_U4:
    case Js::OpCode::Simd128_Not_U8:
    case Js::OpCode::Simd128_Not_U16:
    case Js::OpCode::Simd128_Not_B4:
    case Js::OpCode::Simd128_Not_B8:
    case Js::OpCode::Simd128_Not_B16:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Gt_F4:
    case Js::OpCode::Simd128_Gt_D2:
    case Js::OpCode::Simd128_GtEq_F4:
    case Js::OpCode::Simd128_GtEq_D2:
    case Js::OpCode::Simd128_Lt_I4:
    case Js::OpCode::Simd128_Lt_I8:
    case Js::OpCode::Simd128_Lt_I16:
    {
        Assert(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS
            || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB
            || opcode == Js::OpCode::PCMPGTW );
        // swap operands
        auto *src1 = instr->UnlinkSrc1();
        auto *src2 = instr->UnlinkSrc2();
        instr->SetSrc1(src2);
        instr->SetSrc2(src1);
        break;
    }

    }
    instr->m_opcode = opcode;
    if (legalize)
    {
        //MakeDstEquSrc1(instr);
        Legalize(instr);
    }

    return true;
}